

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegionFileFormat.cpp
# Opt level: O0

vector<char,_std::allocator<char>_> *
RegionFileFormat::readChunk(ChunkHeader *header,int headerIndex,path *param_3,istream *regionFile)

{
  uint32_t uVar1;
  allocator_type *__a;
  char *pcVar2;
  int in_EDX;
  long in_RSI;
  vector<char,_std::allocator<char>_> *in_RDI;
  char *in_R8;
  uint32_t chunkSize;
  vector<char,_std::allocator<char>_> *chunkData;
  allocator<char> *__n;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  allocator<char> local_2e;
  undefined1 local_2d;
  uint32_t local_2c;
  char *local_28;
  
  local_28 = in_R8;
  std::istream::seekg((long)in_R8,*(int *)(in_RSI + (long)in_EDX * 4) << 8);
  std::istream::read(local_28,(long)&local_2c);
  uVar1 = FileStorage::byteswap<unsigned_int,_true>(local_2c);
  local_2c = uVar1 - 4;
  local_2d = 0;
  __a = (allocator_type *)(ulong)local_2c;
  __n = &local_2e;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector(in_stack_ffffffffffffffc0,(size_type)__n,__a);
  std::allocator<char>::~allocator(&local_2e);
  pcVar2 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0x1f6ecc);
  std::istream::read(local_28,(long)pcVar2);
  return in_RDI;
}

Assistant:

std::vector<char> RegionFileFormat::readChunk(ChunkHeader header[], int headerIndex, const fs::path& /*filename*/, std::istream& regionFile) {
    regionFile.seekg(header[headerIndex].offset * SECTOR_SIZE, std::ios::beg);
    uint32_t chunkSize;
    regionFile.read(reinterpret_cast<char*>(&chunkSize), sizeof(chunkSize));
    chunkSize = byteswap(chunkSize) - sizeof(chunkSize);
    std::vector<char> chunkData(chunkSize);
    regionFile.read(chunkData.data(), chunkSize);
    return chunkData;
}